

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_himawari8.cc
# Opt level: O2

void __thiscall Himawari8ImageHandler::overlayMaps(Himawari8ImageHandler *this,File *f,Mat *mat)

{
  return;
}

Assistant:

void Himawari8ImageHandler::overlayMaps(const lrit::File& f, cv::Mat& mat) {
#ifdef HAS_PROJ
  if (config_.maps.empty()) {
    return;
  }

  auto inh = f.getHeader<lrit::ImageNavigationHeader>();
  auto lon = inh.getLongitude();

  // TODO: The map drawer should be cached by construction parameters.
  auto drawer = MapDrawer(&config_, lon, inh);
  mat = drawer.draw(mat);
#endif
}